

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Image * LoadImageFromMemory(Image *__return_storage_ptr__,char *fileType,uchar *fileData,
                           int dataSize)

{
  uchar *__src;
  ushort *puVar1;
  undefined1 uVar2;
  uint uVar3;
  int iVar4;
  _Bool _Var5;
  int i;
  uint uVar6;
  char *__src_00;
  stbi_uc *psVar7;
  float *__ptr;
  void *__dest;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  size_t sVar13;
  int iVar14;
  int iVar15;
  int comp;
  char fileExtLower [16];
  
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  fileExtLower[0] = '\0';
  fileExtLower[1] = '\0';
  fileExtLower[2] = '\0';
  fileExtLower[3] = '\0';
  fileExtLower[4] = '\0';
  fileExtLower[5] = '\0';
  fileExtLower[6] = '\0';
  fileExtLower[7] = '\0';
  fileExtLower[8] = '\0';
  fileExtLower[9] = '\0';
  fileExtLower[10] = '\0';
  fileExtLower[0xb] = '\0';
  fileExtLower[0xc] = '\0';
  fileExtLower[0xd] = '\0';
  fileExtLower[0xe] = '\0';
  fileExtLower[0xf] = '\0';
  __src_00 = TextToLower(fileType);
  strcpy(fileExtLower,__src_00);
  _Var5 = TextIsEqual(fileExtLower,".png");
  if ((_Var5) || (_Var5 = TextIsEqual(fileExtLower,".gif"), _Var5)) {
    if (fileData == (uchar *)0x0) {
      return __return_storage_ptr__;
    }
    comp = 0;
    psVar7 = stbi_load_from_memory
                       (fileData,dataSize,&__return_storage_ptr__->width,
                        &__return_storage_ptr__->height,&comp,0);
    __return_storage_ptr__->data = psVar7;
    __return_storage_ptr__->mipmaps = 1;
    if (3 < comp - 1U) {
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->format = *(int *)(&DAT_0015bab0 + (ulong)(comp - 1U) * 4);
    return __return_storage_ptr__;
  }
  _Var5 = TextIsEqual(fileExtLower,".hdr");
  if (_Var5) {
    if (fileData == (uchar *)0x0) {
      return __return_storage_ptr__;
    }
    comp = 0;
    __ptr = stbi_loadf_from_memory
                      (fileData,dataSize,&__return_storage_ptr__->width,
                       &__return_storage_ptr__->height,&comp,0);
    __return_storage_ptr__->data = __ptr;
    __return_storage_ptr__->mipmaps = 1;
    if (comp == 4) {
      __return_storage_ptr__->format = 10;
      return __return_storage_ptr__;
    }
    if (comp == 3) {
      __return_storage_ptr__->format = 9;
      return __return_storage_ptr__;
    }
    if (comp == 1) {
      __return_storage_ptr__->format = 8;
      return __return_storage_ptr__;
    }
    TraceLog(4,"IMAGE: HDR file format not supported");
    free(__ptr);
    return __return_storage_ptr__;
  }
  _Var5 = TextIsEqual(fileExtLower,".dds");
  if (!_Var5) {
    TraceLog(4,"IMAGE: File format not supported");
    return __return_storage_ptr__;
  }
  if (fileData == (uchar *)0x0) {
LAB_00133a61:
    iVar14 = 0;
    iVar11 = 0;
    iVar15 = 0;
  }
  else {
    if ((((*fileData != 'D') || (fileData[1] != 'D')) || (fileData[2] != 'S')) ||
       (fileData[3] != ' ')) {
      TraceLog(4,"IMAGE: DDS file data not valid");
      goto LAB_00133a61;
    }
    __src = fileData + 0x80;
    iVar11 = *(int *)(fileData + 0xc);
    uVar6 = *(uint *)(fileData + 0x1c);
    iVar15 = uVar6 + (uVar6 == 0);
    iVar14 = *(int *)(fileData + 0x10);
    iVar12 = *(int *)(fileData + 0x58);
    uVar3 = *(uint *)(fileData + 0x50);
    if (iVar12 == 0x10) {
      if (uVar3 == 0x40) {
        sVar13 = (size_t)(iVar11 * iVar14 * 2);
        __dest = malloc(sVar13);
        memcpy(__dest,__src,sVar13);
        iVar12 = 3;
        goto LAB_00133a6c;
      }
      if (uVar3 == 0x41) {
        if (*(int *)(fileData + 0x68) == 0x8000) {
          uVar6 = iVar11 * iVar14;
          __dest = malloc((long)(int)(uVar6 * 2));
          memcpy(__dest,__src,(long)(int)(uVar6 * 2));
          uVar8 = 0;
          uVar10 = (ulong)uVar6;
          if ((int)uVar6 < 1) {
            uVar10 = uVar8;
          }
          iVar12 = 5;
          for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
            puVar1 = (ushort *)((long)__dest + uVar8 * 2);
            *puVar1 = *puVar1 << 1 | (ushort)((short)*puVar1 < 0);
          }
          goto LAB_00133a6c;
        }
        if (*(int *)(fileData + 0x68) == 0xf000) {
          uVar6 = iVar11 * iVar14;
          __dest = malloc((long)(int)(uVar6 * 2));
          memcpy(__dest,__src,(long)(int)(uVar6 * 2));
          uVar8 = 0;
          uVar10 = (ulong)uVar6;
          if ((int)uVar6 < 1) {
            uVar10 = uVar8;
          }
          iVar12 = 6;
          for (; uVar10 != uVar8; uVar8 = uVar8 + 1) {
            puVar1 = (ushort *)((long)__dest + uVar8 * 2);
            *puVar1 = *puVar1 << 4 | *puVar1 >> 0xc;
          }
          goto LAB_00133a6c;
        }
      }
    }
    else {
      if (iVar12 == 0x18 && uVar3 == 0x40) {
        sVar13 = (size_t)(iVar11 * iVar14 * 3);
        __dest = malloc(sVar13);
        memcpy(__dest,__src,sVar13);
        iVar12 = 4;
        goto LAB_00133a6c;
      }
      if (uVar3 == 0x41) {
        if (iVar12 == 0x20) {
          sVar13 = (size_t)(iVar11 * iVar14 * 4);
          __dest = malloc(sVar13);
          memcpy(__dest,__src,sVar13);
          iVar12 = 7;
          for (lVar9 = 0; lVar9 < (long)sVar13; lVar9 = lVar9 + 4) {
            uVar2 = *(undefined1 *)((long)__dest + lVar9);
            *(undefined1 *)((long)__dest + lVar9) = *(undefined1 *)((long)__dest + lVar9 + 2);
            *(undefined1 *)((long)__dest + lVar9 + 2) = uVar2;
          }
          goto LAB_00133a6c;
        }
      }
      else if ((uVar3 & 0xfffffffe) == 4) {
        iVar4 = *(int *)(fileData + 0x54);
        iVar12 = 0;
        if (iVar4 == 0) {
          __dest = (void *)0x0;
        }
        else {
          sVar13 = (size_t)(*(int *)(fileData + 0x14) << (1 < uVar6));
          __dest = malloc(sVar13);
          memcpy(__dest,__src,sVar13);
          if (iVar4 == 0x31545844) {
            iVar12 = (uVar3 != 4) + 0xb;
          }
          else if (iVar4 == 0x33545844) {
            iVar12 = 0xd;
          }
          else if (iVar4 == 0x35545844) {
            iVar12 = 0xe;
          }
        }
        goto LAB_00133a6c;
      }
    }
  }
  __dest = (void *)0x0;
  iVar12 = 0;
LAB_00133a6c:
  __return_storage_ptr__->data = __dest;
  __return_storage_ptr__->width = iVar14;
  __return_storage_ptr__->height = iVar11;
  __return_storage_ptr__->mipmaps = iVar15;
  __return_storage_ptr__->format = iVar12;
  return __return_storage_ptr__;
}

Assistant:

Image LoadImageFromMemory(const char *fileType, const unsigned char *fileData, int dataSize)
{
    Image image = { 0 };

    char fileExtLower[16] = { 0 };
    strcpy(fileExtLower, TextToLower(fileType));

#if defined(SUPPORT_FILEFORMAT_PNG)
    if ((TextIsEqual(fileExtLower, ".png"))
#else
    if ((false)
#endif
#if defined(SUPPORT_FILEFORMAT_BMP)
        || (TextIsEqual(fileExtLower, ".bmp"))
#endif
#if defined(SUPPORT_FILEFORMAT_TGA)
        || (TextIsEqual(fileExtLower, ".tga"))
#endif
#if defined(SUPPORT_FILEFORMAT_JPG)
        || (TextIsEqual(fileExtLower, ".jpg") ||
            TextIsEqual(fileExtLower, ".jpeg"))
#endif
#if defined(SUPPORT_FILEFORMAT_GIF)
        || (TextIsEqual(fileExtLower, ".gif"))
#endif
#if defined(SUPPORT_FILEFORMAT_PIC)
        || (TextIsEqual(fileExtLower, ".pic"))
#endif
#if defined(SUPPORT_FILEFORMAT_PSD)
        || (TextIsEqual(fileExtLower, ".psd"))
#endif
       )
    {
#if defined(STBI_REQUIRED)
        // NOTE: Using stb_image to load images (Supports multiple image formats)

        if (fileData != NULL)
        {
            int comp = 0;
            image.data = stbi_load_from_memory(fileData, dataSize, &image.width, &image.height, &comp, 0);

            image.mipmaps = 1;

            if (comp == 1) image.format = PIXELFORMAT_UNCOMPRESSED_GRAYSCALE;
            else if (comp == 2) image.format = PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA;
            else if (comp == 3) image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8;
            else if (comp == 4) image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;
        }
#endif
    }
#if defined(SUPPORT_FILEFORMAT_HDR)
    else if (TextIsEqual(fileExtLower, ".hdr"))
    {
#if defined(STBI_REQUIRED)
        if (fileData != NULL)
        {
            int comp = 0;
            image.data = stbi_loadf_from_memory(fileData, dataSize, &image.width, &image.height, &comp, 0);

            image.mipmaps = 1;

            if (comp == 1) image.format = PIXELFORMAT_UNCOMPRESSED_R32;
            else if (comp == 3) image.format = PIXELFORMAT_UNCOMPRESSED_R32G32B32;
            else if (comp == 4) image.format = PIXELFORMAT_UNCOMPRESSED_R32G32B32A32;
            else
            {
                TRACELOG(LOG_WARNING, "IMAGE: HDR file format not supported");
                UnloadImage(image);
            }
        }
#endif
    }
#endif
#if defined(SUPPORT_FILEFORMAT_DDS)
    else if (TextIsEqual(fileExtLower, ".dds")) image = LoadDDS(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_PKM)
    else if (TextIsEqual(fileExtLower, ".pkm")) image = LoadPKM(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_KTX)
    else if (TextIsEqual(fileExtLower, ".ktx")) image = LoadKTX(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_PVR)
    else if (TextIsEqual(fileExtLower, ".pvr")) image = LoadPVR(fileData, dataSize);
#endif
#if defined(SUPPORT_FILEFORMAT_ASTC)
    else if (TextIsEqual(fileExtLower, ".astc")) image = LoadASTC(fileData, dataSize);
#endif
    else TRACELOG(LOG_WARNING, "IMAGE: File format not supported");

    return image;
}